

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

sunrealtype IDASensWrmsNorm(IDAMem IDA_mem,N_Vector *xS,N_Vector *wS,int mask)

{
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  sunrealtype nrm;
  int is;
  undefined8 local_28;
  undefined4 local_20;
  
  if (in_ECX == 0) {
    N_VWrmsNormVectorArray
              (*(undefined4 *)(in_RDI + 0xa0),in_RSI,in_RDX,*(undefined8 *)(in_RDI + 0x7f8));
  }
  else {
    N_VWrmsNormMaskVectorArray
              (*(undefined4 *)(in_RDI + 0xa0),in_RSI,in_RDX,*(undefined8 *)(in_RDI + 0x2a8),
               *(undefined8 *)(in_RDI + 0x7f8));
  }
  local_28 = **(double **)(in_RDI + 0x7f8);
  for (local_20 = 1; local_20 < *(int *)(in_RDI + 0xa0); local_20 = local_20 + 1) {
    if (local_28 < *(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_20 * 8)) {
      local_28 = *(double *)(*(long *)(in_RDI + 0x7f8) + (long)local_20 * 8);
    }
  }
  return local_28;
}

Assistant:

sunrealtype IDASensWrmsNorm(IDAMem IDA_mem, N_Vector* xS, N_Vector* wS,
                            sunbooleantype mask)
{
  int is;
  sunrealtype nrm;

  if (mask)
  {
    (void)N_VWrmsNormMaskVectorArray(IDA_mem->ida_Ns, xS, wS, IDA_mem->ida_id,
                                     IDA_mem->ida_cvals);
  }
  else
  {
    (void)N_VWrmsNormVectorArray(IDA_mem->ida_Ns, xS, wS, IDA_mem->ida_cvals);
  }

  nrm = IDA_mem->ida_cvals[0];
  for (is = 1; is < IDA_mem->ida_Ns; is++)
  {
    if (IDA_mem->ida_cvals[is] > nrm) { nrm = IDA_mem->ida_cvals[is]; }
  }

  return (nrm);
}